

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packed_func.h
# Opt level: O2

ostream * tvm::runtime::operator<<(ostream *os,DLDataType t)

{
  uint uVar1;
  char *pcVar2;
  ostream *poVar3;
  uint8_t type_code;
  uint type_code_00;
  uint uVar4;
  string sStack_48;
  
  uVar1 = (uint)t >> 0x10;
  uVar4 = (uint)t >> 8 & 0xff;
  type_code_00 = (uint)t & 0xff;
  if (((uVar1 == 1) && (type_code_00 == 1)) && (uVar4 == 1)) {
    std::operator<<(os,"bool");
  }
  else {
    if (type_code_00 < 0x81) {
      pcVar2 = TypeCode2Str(type_code_00);
      std::operator<<(os,pcVar2);
      if (type_code_00 == 3) {
        return os;
      }
    }
    else {
      poVar3 = std::operator<<(os,"custom[");
      GetCustomTypeName_abi_cxx11_(&sStack_48,(runtime *)(ulong)((uint)t & 0xff),type_code);
      poVar3 = std::operator<<(poVar3,(string *)&sStack_48);
      std::operator<<(poVar3,"]");
      std::__cxx11::string::~string((string *)&sStack_48);
    }
    std::ostream::operator<<(os,uVar4);
    if (uVar1 != 1) {
      poVar3 = std::operator<<(os,'x');
      std::ostream::operator<<(poVar3,uVar1);
    }
  }
  return os;
}

Assistant:

inline std::ostream& operator<<(std::ostream& os, DLDataType t) {  // NOLINT(*)
  if (t.bits == 1 && t.lanes == 1 && t.code == kDLUInt) {
    os << "bool"; return os;
  }
  if (t.code < kTVMCustomBegin) {
    os << TypeCode2Str(t.code);
  } else {
    os << "custom[" << GetCustomTypeName(t.code) << "]";
  }
  if (t.code == kTVMOpaqueHandle) return os;
  os << static_cast<int>(t.bits);
  if (t.lanes != 1) {
    os << 'x' << static_cast<int>(t.lanes);
  }
  return os;
}